

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

void round_digit(char *digits,int ndigits,uint64_t delta,uint64_t rem,uint64_t kappa,uint64_t frac)

{
  bool bVar1;
  uint64_t frac_local;
  uint64_t kappa_local;
  uint64_t rem_local;
  uint64_t delta_local;
  int ndigits_local;
  char *digits_local;
  
  rem_local = rem;
  while( true ) {
    bVar1 = false;
    if (((rem_local < frac) && (bVar1 = false, kappa <= delta - rem_local)) &&
       (bVar1 = true, frac <= rem_local + kappa)) {
      bVar1 = (rem_local + kappa) - frac < frac - rem_local;
    }
    if (!bVar1) break;
    digits[ndigits + -1] = digits[ndigits + -1] + -1;
    rem_local = kappa + rem_local;
  }
  return;
}

Assistant:

static void round_digit(char* digits, int ndigits, uint64_t delta, uint64_t rem,
                        uint64_t kappa, uint64_t frac) {
  while (rem < frac && delta - rem >= kappa &&
         (rem + kappa < frac || frac - rem > rem + kappa - frac)) {
    digits[ndigits - 1]--;
    rem += kappa;
  }
}